

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

uint * __thiscall
Assimp::FBX::MeshGeometry::ToOutputVertexIndex(MeshGeometry *this,uint in_index,uint *count)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  ulong uVar4;
  uint *puVar5;
  long lVar6;
  
  uVar4 = (ulong)in_index;
  puVar3 = (this->m_mapping_counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->m_mapping_counts).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  if (uVar4 < (ulong)(lVar6 >> 2)) {
    if (lVar6 != (long)(this->m_mapping_offsets).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_mapping_offsets).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) {
      __assert_fail("m_mapping_counts.size() == m_mapping_offsets.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXMeshGeometry.cpp"
                    ,0xf7,
                    "const unsigned int *Assimp::FBX::MeshGeometry::ToOutputVertexIndex(unsigned int, unsigned int &) const"
                   );
    }
    uVar1 = puVar3[uVar4];
    *count = uVar1;
    puVar3 = (this->m_mappings).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (this->m_mapping_offsets).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    if ((ulong)((long)(this->m_mappings).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <
        (ulong)(uVar1 + uVar2)) {
      __assert_fail("m_mapping_offsets[ in_index ] + count <= m_mappings.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXMeshGeometry.cpp"
                    ,0xfa,
                    "const unsigned int *Assimp::FBX::MeshGeometry::ToOutputVertexIndex(unsigned int, unsigned int &) const"
                   );
    }
    puVar5 = puVar3 + uVar2;
  }
  else {
    puVar5 = (uint *)0x0;
  }
  return puVar5;
}

Assistant:

const unsigned int* MeshGeometry::ToOutputVertexIndex( unsigned int in_index, unsigned int& count ) const {
    if ( in_index >= m_mapping_counts.size() ) {
        return NULL;
    }

    ai_assert( m_mapping_counts.size() == m_mapping_offsets.size() );
    count = m_mapping_counts[ in_index ];

    ai_assert( m_mapping_offsets[ in_index ] + count <= m_mappings.size() );

    return &m_mappings[ m_mapping_offsets[ in_index ] ];
}